

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O2

bool __thiscall
sptk::GaussianMixtureModelBasedConversion::Run
          (GaussianMixtureModelBasedConversion *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *source_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *target_vectors)

{
  pointer pvVar1;
  pointer pvVar2;
  double *pdVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int m;
  ulong uVar12;
  int iVar13;
  double dVar14;
  vector<double,_std::allocator<double>_> components_of_log_probability;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> d;
  Buffer buffer;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  e;
  
  if (this->is_valid_ == true) {
    pvVar1 = (source_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (source_vectors->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (target_vectors !=
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0 && pvVar1 != pvVar2) {
      uVar6 = ((long)pvVar2 - (long)pvVar1) / 0x18;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&buffer,(long)this->target_length_,
                 &this->magic_number_,(allocator_type *)&d);
      iVar13 = (int)uVar6;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&e,(long)iVar13,(value_type *)&buffer,
               (allocator_type *)&components_of_log_probability);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&buffer);
      SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)&buffer,this->target_length_);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (&d,(long)iVar13,(value_type *)&buffer,
                 (allocator_type *)&components_of_log_probability);
      SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)&buffer);
      std::vector<double,_std::allocator<double>_>::vector
                (&components_of_log_probability,(long)this->num_mixture_,(allocator_type *)&buffer);
      buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_0011eaf0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      buffer.precisions_.
      super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      buffer._73_8_ = 0;
      uVar6 = uVar6 & 0xffffffff;
      if (iVar13 < 1) {
        uVar6 = 0;
      }
      uVar9 = 0;
      do {
        if (uVar9 == uVar6) {
          GaussianMixtureModeling::Buffer::~Buffer(&buffer);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&components_of_log_probability.
                      super__Vector_base<double,_std::allocator<double>_>);
          bVar5 = NonrecursiveMaximumLikelihoodParameterGeneration::Run
                            (&this->mlpg_,&e,&d,target_vectors);
LAB_00106e2a:
          std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&d);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&e);
          return bVar5;
        }
        pvVar1 = (source_vectors->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (this->use_magic_number_ == true) {
          dVar14 = this->magic_number_;
          pdVar3 = pvVar1[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((dVar14 != *pdVar3) || (NAN(dVar14) || NAN(*pdVar3))) goto LAB_00106cc8;
        }
        else {
LAB_00106cc8:
          bVar5 = GaussianMixtureModeling::CalculateLogProbability
                            (this->source_length_ + -1,this->num_mixture_,false,uVar9 == 0,
                             pvVar1 + uVar9,&this->weights_,&this->source_mean_vectors_,
                             &this->source_covariance_matrices_,&components_of_log_probability,
                             (double *)0x0,&buffer);
          if (!bVar5) {
            GaussianMixtureModeling::Buffer::~Buffer(&buffer);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&components_of_log_probability.
                        super__Vector_base<double,_std::allocator<double>_>);
            bVar5 = false;
            goto LAB_00106e2a;
          }
          _Var7 = std::
                  __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (components_of_log_probability.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             components_of_log_probability.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish);
          lVar10 = ((long)_Var7._M_current -
                   (long)components_of_log_probability.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) * 0x20000000 >> 0x1a;
          pvVar1 = (this->e_bias_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar8 = (ulong)(uint)this->source_length_;
          if (this->source_length_ < 1) {
            uVar8 = 0;
          }
          uVar4 = this->target_length_;
          if (this->target_length_ < 1) {
            uVar4 = 0;
          }
          for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
            dVar14 = 0.0;
            for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
              dVar14 = dVar14 + *(double *)
                                 (*(long *)(*(long *)((long)&(((this->e_slope_).
                                                                                                                              
                                                  super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->index_
                                                  ).
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl + lVar10) + uVar11 * 8) + uVar12 * 8) *
                                *(double *)
                                 (*(long *)&(source_vectors->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar9].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data + uVar12 * 8);
            }
            e.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar9].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar11] =
                 dVar14 + *(double *)
                           (*(long *)&pvVar1[(int)((ulong)((long)_Var7._M_current -
                                                          (long)components_of_log_probability.
                                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data + uVar11 * 8);
          }
          SymmetricMatrix::operator=
                    (d.
                     super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar9,
                     (SymmetricMatrix *)
                     ((long)&((this->d_).
                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                     lVar10));
        }
        uVar9 = uVar9 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool GaussianMixtureModelBasedConversion::Run(
    const std::vector<std::vector<double> >& source_vectors,
    std::vector<std::vector<double> >* target_vectors) const {
  // Check inputs.
  if (!is_valid_ || source_vectors.empty() || NULL == target_vectors) {
    return false;
  }

  // Prepare memories.
  const int sequence_length(static_cast<int>(source_vectors.size()));
  std::vector<std::vector<double> > e(
      sequence_length, std::vector<double>(target_length_, magic_number_));
  std::vector<SymmetricMatrix> d(sequence_length,
                                 SymmetricMatrix(target_length_));

  // Compute posterior probabilities of source input.
  {
    std::vector<double> components_of_log_probability(num_mixture_);
    GaussianMixtureModeling::Buffer buffer;
    for (int t(0); t < sequence_length; ++t) {
      if (use_magic_number_ && magic_number_ == source_vectors[t][0]) {
        continue;
      }

      if (!GaussianMixtureModeling::CalculateLogProbability(
              source_length_ - 1, num_mixture_, false, 0 == t,
              source_vectors[t], weights_, source_mean_vectors_,
              source_covariance_matrices_, &components_of_log_probability, NULL,
              &buffer)) {
        return false;
      }

      const int selected_mixture(static_cast<int>(
          std::max_element(components_of_log_probability.begin(),
                           components_of_log_probability.end()) -
          components_of_log_probability.begin()));

      // Set E.
      for (int l(0); l < target_length_; ++l) {
        double tmp(0.0);
        for (int m(0); m < source_length_; ++m) {
          tmp += e_slope_[selected_mixture][l][m] * source_vectors[t][m];
        }
        e[t][l] = e_bias_[selected_mixture][l] + tmp;
      }

      // Set D.
      d[t] = d_[selected_mixture];
    }
  }

  if (!mlpg_.Run(e, d, target_vectors)) {
    return false;
  }

  return true;
}